

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# san.c
# Opt level: O1

void duckdb_je_san_check_stashed_ptrs(void **ptrs,size_t nstashed,size_t usize)

{
  long *plVar1;
  size_t sVar2;
  
  if (nstashed != 0) {
    sVar2 = 0;
    do {
      plVar1 = (long *)ptrs[sVar2];
      if (((*plVar1 != 0x5b5b5b5b5b5b5b5b) ||
          (*(long *)((long)plVar1 + (usize >> 1 & 0xfffffffffffffff8)) != 0x5b5b5b5b5b5b5b5b)) ||
         (*(long *)((long)plVar1 + (usize - 8)) != 0x5b5b5b5b5b5b5b5b)) {
        duckdb_je_safety_check_fail
                  ("<jemalloc>: Write-after-free detected on deallocated pointer %p (size %zu).\n",
                   plVar1,usize);
      }
      sVar2 = sVar2 + 1;
    } while (nstashed != sVar2);
  }
  return;
}

Assistant:

void
san_check_stashed_ptrs(void **ptrs, size_t nstashed, size_t usize) {
	/*
	 * Verify that the junked-filled & stashed pointers remain unchanged, to
	 * detect write-after-free.
	 */
	for (size_t n = 0; n < nstashed; n++) {
		void *stashed = ptrs[n];
		assert(stashed != NULL);
		assert(cache_bin_nonfast_aligned(stashed));
		if (unlikely(san_stashed_corrupted(stashed, usize))) {
			safety_check_fail("<jemalloc>: Write-after-free "
			    "detected on deallocated pointer %p (size %zu).\n",
			    stashed, usize);
		}
	}
}